

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O2

int __thiscall CGL::SceneObjects::EnvironmentLight::init(EnvironmentLight *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pVVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  uint uVar10;
  int j_1;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int j;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_70;
  
  uVar3 = this->envMap->w;
  uVar4 = this->envMap->h;
  iVar20 = (int)uVar3;
  iVar15 = (int)uVar4;
  uVar19 = (ulong)(uint)(iVar20 * iVar15) << 3;
  pdVar8 = (double *)operator_new__(uVar19);
  this->pdf_envmap = pdVar8;
  pdVar8 = (double *)operator_new__(uVar19);
  this->conds_y = pdVar8;
  pdVar8 = (double *)operator_new__((uVar4 & 0xffffffff) * 8);
  this->marginal_y = pdVar8;
  std::operator<<((ostream *)&std::cout,"[PathTracer] Initializing environment light...");
  dVar23 = 0.0;
  uVar19 = 0;
  local_70 = 0.0;
  for (iVar17 = 0; iVar17 != iVar15; iVar17 = iVar17 + 1) {
    iVar18 = (int)uVar19;
    uVar16 = uVar3 & 0xffffffff;
    while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
      pVVar5 = (this->envMap->data).
               super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pVVar5[uVar19].field_0.field_0.y;
      dVar24 = pVVar5[uVar19].field_0.field_0.x;
      dVar2 = pVVar5[uVar19].field_0.field_0.z;
      dVar22 = sin(((dVar23 + 0.5) * 3.141592653589793) / (double)(uVar4 & 0xffffffff));
      dVar22 = dVar22 * (double)(float)(dVar2 * 0.0722000002861023 +
                                       dVar24 * 0.2125999927520752 + dVar1 * 0.7152000069618225);
      this->pdf_envmap[uVar19] = dVar22;
      local_70 = local_70 + dVar22;
      uVar19 = (ulong)((int)uVar19 + 1);
    }
    dVar23 = dVar23 + 1.0;
    uVar19 = (ulong)(uint)(iVar18 + iVar20);
  }
  uVar10 = 0;
  for (iVar17 = 0; iVar17 != iVar15; iVar17 = iVar17 + 1) {
    pdVar8 = this->pdf_envmap;
    uVar19 = uVar3 & 0xffffffff;
    uVar12 = uVar10;
    while( true ) {
      bVar21 = uVar19 == 0;
      uVar19 = uVar19 - 1;
      if (bVar21) break;
      pdVar8[uVar12] = pdVar8[uVar12] / local_70;
      uVar12 = uVar12 + 1;
    }
    uVar10 = uVar10 + iVar20;
  }
  pdVar8 = this->marginal_y;
  uVar19 = 0;
  for (uVar16 = 0; uVar16 != (uVar4 & 0xffffffff); uVar16 = uVar16 + 1) {
    if (uVar16 == 0) {
      dVar23 = 0.0;
    }
    else {
      dVar23 = pdVar8[uVar16 - 1];
    }
    pdVar8[uVar16] = dVar23;
    pdVar6 = this->pdf_envmap;
    uVar13 = uVar3 & 0xffffffff;
    uVar14 = uVar19;
    while (bVar21 = uVar13 != 0, uVar13 = uVar13 - 1, bVar21) {
      dVar23 = dVar23 + pdVar6[uVar14 & 0xffffffff];
      pdVar8[uVar16] = dVar23;
      uVar14 = uVar14 + 1;
    }
    uVar19 = uVar19 + uVar3;
  }
  pdVar8 = this->marginal_y;
  lVar11 = -1;
  for (uVar19 = 0; uVar19 != (uVar4 & 0xffffffff); uVar19 = uVar19 + 1) {
    if (uVar19 == 0) {
      dVar23 = 0.0;
    }
    else {
      dVar23 = pdVar8[uVar19 - 1];
    }
    dVar1 = pdVar8[uVar19];
    pdVar6 = this->pdf_envmap;
    pdVar7 = this->conds_y;
    for (uVar16 = 0; (uVar3 & 0xffffffff) != uVar16; uVar16 = uVar16 + 1) {
      if (uVar16 == 0) {
        dVar24 = 0.0;
        iVar15 = 0;
      }
      else {
        iVar15 = (int)uVar16;
        dVar24 = pdVar7[(uint)((int)lVar11 + iVar15)];
      }
      uVar10 = iVar15 + (int)uVar19 * iVar20;
      pdVar7[uVar10] = dVar24 + pdVar6[uVar10] / (dVar1 - dVar23);
    }
    lVar11 = lVar11 + uVar3;
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"Saving out probability_debug image for debug.");
  std::endl<char,std::char_traits<char>>(poVar9);
  save_probability_debug(this);
  poVar9 = std::operator<<((ostream *)&std::cout,"done.");
  poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
  return (int)poVar9;
}

Assistant:

void EnvironmentLight::init() {
    uint32_t w = envMap->w, h = envMap->h;
    pdf_envmap = new double[w * h];
    conds_y = new double[w * h];
    marginal_y = new double[h];

    std::cout << "[PathTracer] Initializing environment light...";

    // 3-2 Part 3 Task 3 Steps 1,2,3
    // Store the environment map pdf to pdf_envmap
    // Store the marginal distribution for y to marginal_y
    // Store the conditional distribution for x given y to conds_y

    double sum = 0;
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] = envMap->data[w * j + i].illum() * sin(PI * (j + .5) / h);
        sum += pdf_envmap[w * j + i];
      }
    }

    // normalize so pdf_envmap sums to 1
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] /= sum;
      }
    }

    // compute marginal distribution
    for (int j = 0; j < h; ++j) {
      marginal_y[j] = (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        marginal_y[j] += pdf_envmap[w * j + i];
      }
    }

    // compute conditional distributions
    for (int j = 0; j < h; ++j) {
      double marginal_density = marginal_y[j] - (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        conds_y[w * j + i] = (i == 0 ? 0 : conds_y[w * j + i - 1]) + pdf_envmap[w * j + i] / marginal_density;
      }
    }

    if (true)
      std::cout << "Saving out probability_debug image for debug." << std::endl;
    save_probability_debug();

    std::cout << "done." << std::endl;
  }